

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O0

char * al_get_default_shader_source(ALLEGRO_SHADER_PLATFORM platform,ALLEGRO_SHADER_TYPE type)

{
  ALLEGRO_SHADER_PLATFORM AVar1;
  int in_ESI;
  ALLEGRO_SHADER_PLATFORM in_EDI;
  
  AVar1 = resolve_platform(in_EDI);
  if ((AVar1 != ALLEGRO_SHADER_AUTO) && (AVar1 == ALLEGRO_SHADER_GLSL)) {
    if (in_ESI == 1) {
      return default_glsl_vertex_source;
    }
    if (in_ESI == 2) {
      return default_glsl_pixel_source;
    }
  }
  return (char *)0x0;
}

Assistant:

char const *al_get_default_shader_source(ALLEGRO_SHADER_PLATFORM platform,
   ALLEGRO_SHADER_TYPE type)
{
   (void)type;
   switch (resolve_platform(platform)) {
      case ALLEGRO_SHADER_GLSL:
#ifdef ALLEGRO_CFG_SHADER_GLSL
         switch (type) {
            case ALLEGRO_VERTEX_SHADER:
               return default_glsl_vertex_source;
            case ALLEGRO_PIXEL_SHADER:
               return default_glsl_pixel_source;
         }
#endif
         break;

      case ALLEGRO_SHADER_HLSL:
#ifdef ALLEGRO_CFG_SHADER_HLSL
         switch (type) {
            case ALLEGRO_VERTEX_SHADER:
               return default_hlsl_vertex_source;
            case ALLEGRO_PIXEL_SHADER:
               return default_hlsl_pixel_source;
         }
#endif
         break;

      case ALLEGRO_SHADER_AUTO:
         ASSERT(0);
   }
   return NULL;
}